

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_lite.cc
# Opt level: O3

int __thiscall
google::protobuf::compiler::java::ImmutableMessageLiteGenerator::GenerateStaticVariableInitializers
          (ImmutableMessageLiteGenerator *this,Printer *printer)

{
  Descriptor *pDVar1;
  long lVar2;
  long lVar3;
  ImmutableMessageLiteGenerator local_70;
  
  pDVar1 = (this->super_MessageGenerator).descriptor_;
  if (0 < *(int *)(pDVar1 + 0x48)) {
    lVar2 = 0;
    lVar3 = 0;
    do {
      ImmutableMessageLiteGenerator
                (&local_70,(Descriptor *)(*(long *)(pDVar1 + 0x50) + lVar2),this->context_);
      GenerateStaticVariableInitializers(&local_70,printer);
      local_70.super_MessageGenerator._vptr_MessageGenerator =
           (_func_int **)&PTR__ImmutableMessageLiteGenerator_00420710;
      FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::
      ~FieldGeneratorMap(&local_70.field_generators_);
      MessageGenerator::~MessageGenerator(&local_70.super_MessageGenerator);
      lVar3 = lVar3 + 1;
      pDVar1 = (this->super_MessageGenerator).descriptor_;
      lVar2 = lVar2 + 0xa8;
    } while (lVar3 < *(int *)(pDVar1 + 0x48));
  }
  return 0;
}

Assistant:

int ImmutableMessageLiteGenerator::GenerateStaticVariableInitializers(
    io::Printer* printer) {
  int bytecode_estimate = 0;
  // Generate static member initializers for all nested types.
  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    // TODO(kenton):  Reuse MessageGenerator objects?
    bytecode_estimate +=
        ImmutableMessageLiteGenerator(descriptor_->nested_type(i), context_)
            .GenerateStaticVariableInitializers(printer);
  }
  return bytecode_estimate;
}